

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O3

void __thiscall
vkt::compute::anon_unknown_0::InvertSSBOInPlaceTest::initPrograms
          (InvertSSBOInPlaceTest *this,SourceCollections *sourceCollections)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  ostringstream src;
  string local_350;
  long *local_330;
  long local_328;
  long local_320 [2];
  uint local_310 [2];
  value_type local_308 [3];
  ios_base local_2a0 [264];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout (local_size_x = ",0x17);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_y = ",0x11);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_z = ",0x11);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_localSize).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"layout(binding = 0) buffer InOut {\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    uint values[",0x10);
  if (this->m_sized == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
    std::ostream::_M_insert<unsigned_long>((ulong)local_310);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
    std::ios_base::~ios_base(local_2a0);
  }
  else {
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"");
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_350._M_dataplus._M_p,local_350._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} sb_inout;\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "    uint numValuesPerInv = uint(sb_inout.values.length()) / (size.x*size.y*size.z);\n"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
             ,0x7d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    uint offset          = numValuesPerInv*groupNdx;\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"        sb_inout.values[offset + ndx] = ~sb_inout.values[offset + ndx];\n",0x48
            );
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  paVar1 = &local_350.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_350._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"comp","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_350);
  std::__cxx11::stringbuf::str();
  local_310[0] = 5;
  local_308[0]._M_dataplus._M_p = (pointer)&local_308[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,local_330,local_328 + (long)local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_310[0],local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0]._M_dataplus._M_p != &local_308[0].field_2) {
    operator_delete(local_308[0]._M_dataplus._M_p,local_308[0].field_2._M_allocated_capacity + 1);
  }
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void InvertSSBOInPlaceTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut {\n"
		<< "    uint values[" << (m_sized ? de::toString(m_numValues) : "") << "];\n"
		<< "} sb_inout;\n"
		<< "void main (void) {\n"
		<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
		<< "    uint numValuesPerInv = uint(sb_inout.values.length()) / (size.x*size.y*size.z);\n"
		<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
		<< "    uint offset          = numValuesPerInv*groupNdx;\n"
		<< "\n"
		<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
		<< "        sb_inout.values[offset + ndx] = ~sb_inout.values[offset + ndx];\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}